

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

void * mpc_malloc(mpc_input_t *i,size_t n)

{
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  
  if (n < 0x41) {
    uVar1 = i->mem_index;
    uVar3 = uVar1;
    do {
      if (i->mem_full[uVar3] == '\0') {
        i->mem_full[uVar3] = '\x01';
        i->mem_index = (ulong)((int)i->mem_index + 1U & 0x1ff);
        return i->mem + uVar3;
      }
      uVar3 = (ulong)((int)uVar3 + 1U & 0x1ff);
      i->mem_index = uVar3;
    } while (uVar1 != uVar3);
  }
  pvVar2 = malloc(n);
  return pvVar2;
}

Assistant:

static void *mpc_malloc(mpc_input_t *i, size_t n) {
  size_t j;
  char *p;

  if (n > sizeof(mpc_mem_t)) { return malloc(n); }

  j = i->mem_index;
  do {
    if (!i->mem_full[i->mem_index]) {
      p = (void*)(i->mem + i->mem_index);
      i->mem_full[i->mem_index] = 1;
      i->mem_index = (i->mem_index+1) % MPC_INPUT_MEM_NUM;
      return p;
    }
    i->mem_index = (i->mem_index+1) % MPC_INPUT_MEM_NUM;
  } while (j != i->mem_index);

  return malloc(n);
}